

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Iterator * __thiscall
leveldb::Version::NewConcatenatingIterator(Version *this,ReadOptions *options,int level)

{
  VersionSet *pVVar1;
  Iterator *pIVar2;
  
  pIVar2 = (Iterator *)operator_new(0x58);
  pVVar1 = this->vset_;
  Iterator::Iterator(pIVar2);
  pIVar2->_vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_00136270;
  pIVar2[1]._vptr_Iterator = (_func_int **)&PTR__Comparator_00136110;
  pIVar2[1].cleanup_head_.function = (CleanupFunction)(pVVar1->icmp_).user_comparator_;
  pIVar2[1].cleanup_head_.arg1 = this->files_ + level;
  *(int *)&pIVar2[1].cleanup_head_.arg2 =
       (int)((ulong)((long)this->files_[level].
                           super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)this->files_[level].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pIVar2 = NewTwoLevelIterator(pIVar2,GetFileIterator,this->vset_->table_cache_,options);
  return pIVar2;
}

Assistant:

Iterator* Version::NewConcatenatingIterator(const ReadOptions& options,
                                            int level) const {
  return NewTwoLevelIterator(
      new LevelFileNumIterator(vset_->icmp_, &files_[level]), &GetFileIterator,
      vset_->table_cache_, options);
}